

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5NewTransaction(Fts5FullTable *pTab)

{
  int iVar1;
  Fts5Index *p;
  Fts5Cursor *pFVar2;
  i64 iVar3;
  
  pFVar2 = pTab->pGlobal->pCsr;
  while( true ) {
    if (pFVar2 == (Fts5Cursor *)0x0) {
      p = pTab->pStorage->pIndex;
      iVar3 = fts5IndexDataVersion(p);
      if ((iVar3 != p->iStructVersion) && (p->pStruct != (Fts5Structure *)0x0)) {
        fts5StructureRelease(p->pStruct);
        p->pStruct = (Fts5Structure *)0x0;
      }
      iVar1 = p->rc;
      p->rc = 0;
      return iVar1;
    }
    if ((Fts5FullTable *)(pFVar2->base).pVtab == pTab) break;
    pFVar2 = pFVar2->pNext;
  }
  return 0;
}

Assistant:

static int fts5NewTransaction(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->base.pVtab==(sqlite3_vtab*)pTab ) return SQLITE_OK;
  }
  return sqlite3Fts5StorageReset(pTab->pStorage);
}